

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

void __thiscall CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  TestFilter *pTVar1;
  TestFilter *pTVar2;
  TestFilter *current;
  
  this->_vptr_CommandLineArguments = (_func_int **)&PTR__CommandLineArguments_0012eca0;
  while (pTVar1 = this->groupFilters_, pTVar1 != (TestFilter *)0x0) {
    pTVar2 = TestFilter::getNext(pTVar1);
    this->groupFilters_ = pTVar2;
    SimpleString::~SimpleString(&pTVar1->filter_);
    operator_delete(pTVar1,0x20);
  }
  while (pTVar1 = this->nameFilters_, pTVar1 != (TestFilter *)0x0) {
    pTVar2 = TestFilter::getNext(pTVar1);
    this->nameFilters_ = pTVar2;
    SimpleString::~SimpleString(&pTVar1->filter_);
    operator_delete(pTVar1,0x20);
  }
  SimpleString::~SimpleString(&this->packageName_);
  return;
}

Assistant:

CommandLineArguments::~CommandLineArguments()
{
    while(groupFilters_) {
        TestFilter* current = groupFilters_;
        groupFilters_ = groupFilters_->getNext();
        delete current;
    }
    while(nameFilters_) {
        TestFilter* current = nameFilters_;
        nameFilters_ = nameFilters_->getNext();
        delete current;
    }
}